

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::AddDefaultExtraGenerators(cmake *this)

{
  RegisteredExtraGeneratorsVector *this_00;
  pointer *pppcVar1;
  iterator iVar2;
  cmExternalMakefileProjectGeneratorFactory *local_18;
  
  this_00 = &this->ExtraGenerators;
  local_18 = cmExtraCodeBlocksGenerator::GetFactory();
  iVar2._M_current =
       (this->ExtraGenerators).
       super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
    ::_M_realloc_insert<cmExternalMakefileProjectGeneratorFactory*>
              ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
                *)this_00,iVar2,&local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppcVar1 = &(this->ExtraGenerators).
                super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = cmExtraCodeLiteGenerator::GetFactory();
  iVar2._M_current =
       (this->ExtraGenerators).
       super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
    ::_M_realloc_insert<cmExternalMakefileProjectGeneratorFactory*>
              ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
                *)this_00,iVar2,&local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppcVar1 = &(this->ExtraGenerators).
                super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = cmExtraSublimeTextGenerator::GetFactory();
  iVar2._M_current =
       (this->ExtraGenerators).
       super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
    ::_M_realloc_insert<cmExternalMakefileProjectGeneratorFactory*>
              ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
                *)this_00,iVar2,&local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppcVar1 = &(this->ExtraGenerators).
                super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = cmExtraKateGenerator::GetFactory();
  iVar2._M_current =
       (this->ExtraGenerators).
       super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
    ::_M_realloc_insert<cmExternalMakefileProjectGeneratorFactory*>
              ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
                *)this_00,iVar2,&local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppcVar1 = &(this->ExtraGenerators).
                super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = cmExtraEclipseCDT4Generator::GetFactory();
  iVar2._M_current =
       (this->ExtraGenerators).
       super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
    ::_M_realloc_insert<cmExternalMakefileProjectGeneratorFactory*>
              ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
                *)this_00,iVar2,&local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppcVar1 = &(this->ExtraGenerators).
                super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = cmGlobalKdevelopGenerator::GetFactory();
  iVar2._M_current =
       (this->ExtraGenerators).
       super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
    ::_M_realloc_insert<cmExternalMakefileProjectGeneratorFactory*>
              ((vector<cmExternalMakefileProjectGeneratorFactory*,std::allocator<cmExternalMakefileProjectGeneratorFactory*>>
                *)this_00,iVar2,&local_18);
  }
  else {
    *iVar2._M_current = local_18;
    pppcVar1 = &(this->ExtraGenerators).
                super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void cmake::AddDefaultExtraGenerators()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->ExtraGenerators.push_back(cmExtraCodeBlocksGenerator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraCodeLiteGenerator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraSublimeTextGenerator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraKateGenerator::GetFactory());

#ifdef CMAKE_USE_ECLIPSE
  this->ExtraGenerators.push_back(cmExtraEclipseCDT4Generator::GetFactory());
#endif

#ifdef CMAKE_USE_KDEVELOP
  this->ExtraGenerators.push_back(cmGlobalKdevelopGenerator::GetFactory());
#endif
#endif
}